

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

void http_parse_cookies(http_s *h,uint8_t is_url_encoded)

{
  size_t __n;
  uint uVar1;
  size_t sVar2;
  uint64_t uVar3;
  FIOBJ FVar4;
  FIOBJ FVar5;
  code *pcVar6;
  FIOBJ FVar7;
  fiobj_object_vtable_s *pfVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  size_t pos;
  char *pcVar12;
  bool bVar13;
  fio_str_info_s s;
  fio_str_info_s local_68;
  code *local_50;
  FIOBJ local_48;
  http_s *local_40;
  code *local_38;
  
  if (h->headers == 0) {
    return;
  }
  if ((h->cookies != 0) && (sVar2 = fiobj_hash_count(h->cookies), sVar2 != 0)) {
    if (FIO_LOG_LEVEL < 3) {
      return;
    }
    FIO_LOG2STDERR("WARNING: (http) attempting to parse cookies more than once.");
    return;
  }
  uVar3 = http_parse_cookies::setcookie_header_hash;
  if (http_parse_cookies::setcookie_header_hash == 0) {
    if (((uint)HTTP_HEADER_SET_COOKIE & 7) == 2) {
      uVar3 = fiobj_str_hash(HTTP_HEADER_SET_COOKIE);
    }
    else {
      uVar1 = (uint)HTTP_HEADER_SET_COOKIE & 6;
      uVar3 = HTTP_HEADER_SET_COOKIE;
      if (((uVar1 != 6) && (uVar3 = HTTP_HEADER_SET_COOKIE, HTTP_HEADER_SET_COOKIE != 0)) &&
         (uVar3 = HTTP_HEADER_SET_COOKIE, (HTTP_HEADER_SET_COOKIE & 1) == 0)) {
        if ((HTTP_HEADER_SET_COOKIE & 6) == 0) {
          switch(*(undefined1 *)(HTTP_HEADER_SET_COOKIE & 0xfffffffffffffff8)) {
          case 0x27:
            pfVar8 = &FIOBJECT_VTABLE_FLOAT;
            break;
          case 0x28:
            goto switchD_0014b064_caseD_28;
          case 0x29:
            pfVar8 = &FIOBJECT_VTABLE_ARRAY;
            break;
          case 0x2a:
            goto switchD_0014b064_caseD_2a;
          case 0x2b:
            pfVar8 = &FIOBJECT_VTABLE_DATA;
            break;
          default:
            pfVar8 = &FIOBJECT_VTABLE_NUMBER;
          }
        }
        else if (uVar1 == 2) {
switchD_0014b064_caseD_28:
          pfVar8 = &FIOBJECT_VTABLE_STRING;
        }
        else {
switchD_0014b064_caseD_2a:
          pfVar8 = &FIOBJECT_VTABLE_HASH;
        }
        (*pfVar8->to_str)(&local_68,HTTP_HEADER_SET_COOKIE);
        uVar3 = fio_siphash13(local_68.data,local_68.len,0x1456f2,0x145bc9);
      }
    }
  }
  http_parse_cookies::setcookie_header_hash = uVar3;
  FVar5 = h->headers;
  if (((uint)HTTP_HEADER_COOKIE & 7) == 2) {
    FVar4 = fiobj_str_hash(HTTP_HEADER_COOKIE);
  }
  else {
    uVar1 = (uint)HTTP_HEADER_COOKIE & 6;
    FVar4 = HTTP_HEADER_COOKIE;
    if (((uVar1 != 6) && (HTTP_HEADER_COOKIE != 0)) && ((HTTP_HEADER_COOKIE & 1) == 0)) {
      if ((HTTP_HEADER_COOKIE & 6) == 0) {
        switch(*(undefined1 *)(HTTP_HEADER_COOKIE & 0xfffffffffffffff8)) {
        case 0x27:
          pfVar8 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case 0x28:
          goto switchD_0014b11d_caseD_28;
        case 0x29:
          pfVar8 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case 0x2a:
          goto switchD_0014b11d_caseD_2a;
        case 0x2b:
          pfVar8 = &FIOBJECT_VTABLE_DATA;
          break;
        default:
          pfVar8 = &FIOBJECT_VTABLE_NUMBER;
        }
      }
      else if (uVar1 == 2) {
switchD_0014b11d_caseD_28:
        pfVar8 = &FIOBJECT_VTABLE_STRING;
      }
      else {
switchD_0014b11d_caseD_2a:
        pfVar8 = &FIOBJECT_VTABLE_HASH;
      }
      (*pfVar8->to_str)(&local_68,HTTP_HEADER_COOKIE);
      FVar4 = fio_siphash13(local_68.data,local_68.len,0x1456f2,0x145bc9);
    }
  }
  FVar5 = fiobj_hash_get2(FVar5,FVar4);
  local_40 = h;
  if (FVar5 != 0) {
    FVar4 = h->cookies;
    if (FVar4 == 0) {
      FVar4 = fiobj_hash_new();
      h->cookies = FVar4;
    }
    if (((~(uint)FVar5 & 6) == 0 || (FVar5 & 1) != 0) ||
       (*(char *)(FVar5 & 0xfffffffffffffff8) != ')')) {
      if ((((uint)FVar5 & 7) == 2) &&
         (fio_str2str(&local_68,FVar5), h = local_40, local_68.len != 0)) {
        do {
          pcVar12 = local_68.data;
          sVar2 = local_68.len;
          if (*local_68.data == ' ') {
            pcVar9 = local_68.data + 1;
            local_68.len = local_68.len - 1;
          }
          else {
            pcVar11 = (char *)memchr(local_68.data,0x3d,local_68.len);
            if (pcVar11 == (char *)0x0) {
              pcVar11 = pcVar12;
            }
            pcVar10 = (char *)memchr(pcVar11,0x3b,(long)(pcVar12 + sVar2) - (long)pcVar11);
            pcVar9 = pcVar12 + sVar2;
            if (pcVar10 != (char *)0x0) {
              pcVar9 = pcVar10;
            }
            http_add2hash(FVar4,pcVar12,(long)pcVar11 - (long)pcVar12,pcVar11 + 1,
                          (long)pcVar9 - (long)(pcVar11 + 1),is_url_encoded);
            pcVar9 = pcVar9 + 1;
            bVar13 = local_68.len < (ulong)((long)pcVar9 - (long)local_68.data);
            local_68.len = local_68.len - ((long)pcVar9 - (long)local_68.data);
            if (bVar13) {
              local_68.len = 0;
            }
          }
          h = local_40;
          local_68.data = pcVar9;
        } while (local_68.len != 0);
      }
    }
    else {
      pcVar6 = (code *)fiobj_ary_count(FVar5);
      if (pcVar6 != (code *)0x0) {
        local_38 = fio_str2str;
        sVar2 = 0;
        local_50 = pcVar6;
        local_48 = FVar5;
        do {
          FVar4 = h->cookies;
          FVar7 = fiobj_ary_index(FVar5,sVar2);
          if (((uint)FVar7 & 7) == 2) {
            (*local_38)(&local_68,FVar7);
            __n = local_68.len;
            pcVar12 = local_68.data;
            pcVar6 = local_50;
            FVar5 = local_48;
            while (local_68.len = __n, local_68.data = pcVar12, local_50 = pcVar6, local_48 = FVar5,
                  __n != 0) {
              if (*pcVar12 == ' ') {
                pcVar12 = pcVar12 + 1;
                __n = __n - 1;
              }
              else {
                pcVar11 = (char *)memchr(pcVar12,0x3d,__n);
                if (pcVar11 == (char *)0x0) {
                  pcVar11 = pcVar12;
                }
                pcVar10 = (char *)memchr(pcVar11,0x3b,(long)(pcVar12 + __n) - (long)pcVar11);
                pcVar9 = pcVar12 + __n;
                if (pcVar10 != (char *)0x0) {
                  pcVar9 = pcVar10;
                }
                http_add2hash(FVar4,pcVar12,(long)pcVar11 - (long)pcVar12,pcVar11 + 1,
                              (long)pcVar9 - (long)(pcVar11 + 1),is_url_encoded);
                pcVar12 = pcVar9 + 1;
                __n = 0;
                pcVar6 = local_50;
                FVar5 = local_48;
                if ((ulong)((long)pcVar12 - (long)local_68.data) <= local_68.len) {
                  __n = local_68.len - ((long)pcVar12 - (long)local_68.data);
                }
              }
            }
          }
          sVar2 = sVar2 + 1;
          h = local_40;
        } while ((code *)sVar2 != pcVar6);
      }
    }
  }
  FVar5 = h->headers;
  if (((uint)HTTP_HEADER_SET_COOKIE & 7) == 2) {
    uVar3 = fiobj_str_hash(HTTP_HEADER_SET_COOKIE);
    goto LAB_0014b45b;
  }
  uVar1 = (uint)HTTP_HEADER_SET_COOKIE & 6;
  uVar3 = HTTP_HEADER_SET_COOKIE;
  if (((uVar1 == 6) || (HTTP_HEADER_SET_COOKIE == 0)) || ((HTTP_HEADER_SET_COOKIE & 1) != 0))
  goto LAB_0014b45b;
  if ((HTTP_HEADER_SET_COOKIE & 6) == 0) {
    switch(*(undefined1 *)(HTTP_HEADER_SET_COOKIE & 0xfffffffffffffff8)) {
    case 0x27:
      pfVar8 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      goto switchD_0014b420_caseD_28;
    case 0x29:
      pfVar8 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      goto switchD_0014b420_caseD_2a;
    case 0x2b:
      pfVar8 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar8 = &FIOBJECT_VTABLE_NUMBER;
    }
  }
  else if (uVar1 == 2) {
switchD_0014b420_caseD_28:
    pfVar8 = &FIOBJECT_VTABLE_STRING;
  }
  else {
switchD_0014b420_caseD_2a:
    pfVar8 = &FIOBJECT_VTABLE_HASH;
  }
  (*pfVar8->to_str)(&local_68,HTTP_HEADER_SET_COOKIE);
  uVar3 = fio_siphash13(local_68.data,local_68.len,0x1456f2,0x145bc9);
LAB_0014b45b:
  FVar5 = fiobj_hash_get2(FVar5,uVar3);
  if (FVar5 != 0) {
    FVar4 = h->cookies;
    if (FVar4 == 0) {
      FVar4 = fiobj_hash_new();
      h->cookies = FVar4;
    }
    if (((~(uint)FVar5 & 6) == 0 || (FVar5 & 1) != 0) ||
       (*(char *)(FVar5 & 0xfffffffffffffff8) != ')')) {
      if (((uint)FVar5 & 7) == 2) {
        fio_str2str(&local_68,FVar5);
        pcVar12 = local_68.data;
        sVar2 = local_68.len;
        pcVar11 = (char *)memchr(local_68.data,0x3d,local_68.len);
        if (pcVar11 == (char *)0x0) {
          pcVar11 = pcVar12;
        }
        pcVar10 = (char *)memchr(pcVar11,0x3b,(long)(pcVar12 + sVar2) - (long)pcVar11);
        pcVar9 = pcVar12 + sVar2;
        if (pcVar10 != (char *)0x0) {
          pcVar9 = pcVar10;
        }
        if (pcVar11 < pcVar9) {
          http_add2hash(FVar4,pcVar12,(long)pcVar11 - (long)pcVar12,pcVar11 + 1,
                        (long)pcVar9 - (long)(pcVar11 + 1),is_url_encoded);
        }
      }
    }
    else {
      sVar2 = fiobj_ary_count(FVar5);
      if (sVar2 != 0) {
        local_50 = fio_str2str;
        pos = 0;
        local_48 = sVar2;
        do {
          FVar4 = h->cookies;
          FVar7 = fiobj_ary_index(FVar5,pos);
          if (((uint)FVar7 & 7) == 2) {
            (*local_50)(&local_68,FVar7);
            pcVar12 = local_68.data;
            sVar2 = local_68.len;
            pcVar9 = (char *)memchr(local_68.data,0x3d,local_68.len);
            pcVar11 = pcVar12;
            if (pcVar9 != (char *)0x0) {
              pcVar11 = pcVar9;
            }
            pcVar10 = (char *)memchr(pcVar11,0x3b,(long)(pcVar12 + sVar2) - (long)pcVar11);
            pcVar9 = pcVar12 + sVar2;
            if (pcVar10 != (char *)0x0) {
              pcVar9 = pcVar10;
            }
            h = local_40;
            sVar2 = local_48;
            if (pcVar11 < pcVar9) {
              http_add2hash(FVar4,pcVar12,(long)pcVar11 - (long)pcVar12,pcVar11 + 1,
                            (long)pcVar9 - (long)(pcVar11 + 1),is_url_encoded);
              h = local_40;
              sVar2 = local_48;
            }
          }
          pos = pos + 1;
        } while (sVar2 != pos);
      }
    }
  }
  return;
}

Assistant:

void http_parse_cookies(http_s *h, uint8_t is_url_encoded) {
  if (!h->headers)
    return;
  if (h->cookies && fiobj_hash_count(h->cookies)) {
    FIO_LOG_WARNING("(http) attempting to parse cookies more than once.");
    return;
  }
  static uint64_t setcookie_header_hash;
  if (!setcookie_header_hash)
    setcookie_header_hash = fiobj_obj2hash(HTTP_HEADER_SET_COOKIE);
  FIOBJ c = fiobj_hash_get2(h->headers, fiobj_obj2hash(HTTP_HEADER_COOKIE));
  if (c) {
    if (!h->cookies)
      h->cookies = fiobj_hash_new();
    if (FIOBJ_TYPE_IS(c, FIOBJ_T_ARRAY)) {
      /* Array of Strings */
      size_t count = fiobj_ary_count(c);
      for (size_t i = 0; i < count; ++i) {
        http_parse_cookies_cookie_str(
            h->cookies, fiobj_ary_index(c, (int64_t)i), is_url_encoded);
      }
    } else {
      /* single string */
      http_parse_cookies_cookie_str(h->cookies, c, is_url_encoded);
    }
  }
  c = fiobj_hash_get2(h->headers, fiobj_obj2hash(HTTP_HEADER_SET_COOKIE));
  if (c) {
    if (!h->cookies)
      h->cookies = fiobj_hash_new();
    if (FIOBJ_TYPE_IS(c, FIOBJ_T_ARRAY)) {
      /* Array of Strings */
      size_t count = fiobj_ary_count(c);
      for (size_t i = 0; i < count; ++i) {
        http_parse_cookies_setcookie_str(
            h->cookies, fiobj_ary_index(c, (int64_t)i), is_url_encoded);
      }
    } else {
      /* single string */
      http_parse_cookies_setcookie_str(h->cookies, c, is_url_encoded);
    }
  }
}